

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Project: ",0xb);
  __s = (((this->super_cmLocalGenerator).Makefile)->ProjectName)._M_dataplus._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
  std::ostream::put((char)os);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# Configuration: ",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->ConfigName)._M_dataplus._M_p,(this->ConfigName)._M_string_length
                     );
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cmGlobalNinjaGenerator::WriteDivider(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Project: " << this->GetMakefile()->GetProjectName() << std::endl
    << "# Configuration: " << this->ConfigName << std::endl
    ;
  cmGlobalNinjaGenerator::WriteDivider(os);
}